

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall
helics::apps::Recorder::loadJsonFile
          (Recorder *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  _Map_pointer ppIVar1;
  _Map_pointer ppEVar2;
  _Map_pointer ppEVar3;
  _Elt_pointer pEVar4;
  bool bVar5;
  int iVar6;
  Input *__args;
  _Elt_pointer pIVar7;
  Endpoint *pEVar8;
  string *psVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  reference pbVar12;
  ulong uVar13;
  _Elt_pointer pIVar14;
  _Elt_pointer pEVar15;
  _Elt_pointer pIVar16;
  int iVar17;
  string_view key;
  string_view key_00;
  string_view sourceEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint;
  string_view destEndpoint_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view sourceEndpoint_02;
  string_view destEndpoint_02;
  iterator __begin3;
  value_type clones;
  json doc;
  value_type captures;
  value_type destClone;
  value_type sourceClone;
  value_type tags;
  iterator __end3;
  undefined1 local_118 [32];
  _Rb_tree_node_base *local_f8;
  size_t local_f0;
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [16];
  data local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_68;
  string *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"recorder","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,(string *)local_118,jsonString,enableFederateInterfaceRegistration);
  local_48 = jsonString;
  if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  iVar6 = helics::ValueFederate::getInputCount
                    (&((this->super_App).fed.
                       super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ValueFederate);
  if (0 < iVar6) {
    local_e8._M_right = (_Base_ptr)&this->subscriptions;
    local_e8._M_left = (_Base_ptr)&this->targets;
    iVar17 = 0;
    do {
      __args = helics::ValueFederate::getInput
                         (&((this->super_App).fed.
                            super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ValueFederate,iVar17);
      std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
                ((deque<helics::Input,std::allocator<helics::Input>> *)local_e8._M_right,__args);
      pIVar7 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pIVar7 == (this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pIVar7 = (this->subscriptions).
                 super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      if (pIVar7[-1].givenTarget._M_string_length == 0) {
        psVar9 = Interface::getSourceTargets_abi_cxx11_(&pIVar7[-1].super_Interface);
      }
      else {
        psVar9 = (string *)&pIVar7[-1].givenTarget;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_e8._M_left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
      pIVar7 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      ppIVar1 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar13 = (long)pIVar7 -
               (long)(this->subscriptions).
                     super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first;
      if (uVar13 == 0) {
        pIVar7 = ppIVar1[-1] + 1;
      }
      local_118._0_4_ = pIVar7[-1].super_Interface.handle.hid;
      local_68.m_object =
           (pointer)CONCAT44(local_68.m_object._4_4_,
                             (int)((ulong)((long)(this->subscriptions).
                                                 super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                                          (long)(this->subscriptions).
                                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                  4) * 0x286bca1b +
                             (int)((ulong)((long)ppIVar1 -
                                          (long)(this->subscriptions).
                                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_node) >>
                                  3) + (int)(uVar13 >> 4) * 0x286bca1b +
                                       (uint)(ppIVar1 == (_Map_pointer)0x0) + -2);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
      ::_M_emplace_unique<helics::InterfaceHandle,int>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                  *)&this->subids,(InterfaceHandle *)local_118,(int *)(local_78 + 0x10));
      pIVar7 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      pIVar14 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first;
      pIVar16 = pIVar7;
      if (pIVar7 == pIVar14) {
        pIVar16 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      if (pIVar16[-1].givenTarget._M_string_length == 0) {
        psVar9 = Interface::getSourceTargets_abi_cxx11_(&pIVar16[-1].super_Interface);
        pIVar7 = (this->subscriptions).
                 super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        pIVar14 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first;
      }
      else {
        psVar9 = (string *)&pIVar16[-1].givenTarget;
      }
      ppIVar1 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_118._0_4_ =
           (int)((ulong)((long)pIVar7 - (long)pIVar14) >> 4) * 0x286bca1b +
           (int)((ulong)((long)ppIVar1 -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) +
           (uint)(ppIVar1 == (_Map_pointer)0x0) +
           (int)((ulong)((long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * 0x286bca1b +
           -2;
      std::
      _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,int>
                ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
                  *)&this->subkeys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9,
                 (int *)local_118);
      iVar17 = iVar17 + 1;
    } while (iVar6 != iVar17);
  }
  iVar6 = helics::MessageFederate::getEndpointCount
                    ((MessageFederate *)
                     &(((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate).field_0x10);
  if (0 < iVar6) {
    local_e8._M_right = (_Base_ptr)&this->endpoints;
    local_e8._M_left = (_Base_ptr)&this->eptNames;
    iVar17 = 0;
    do {
      pEVar8 = helics::MessageFederate::getEndpoint
                         ((MessageFederate *)
                          &(((this->super_App).fed.
                             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ValueFederate).field_0x10,iVar17);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)local_e8._M_right,
                 pEVar8);
      ppEVar2 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      ppEVar3 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      pEVar8 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      uVar13 = (long)pEVar8 -
               (long)(this->endpoints).
                     super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first;
      if (uVar13 == 0) {
        pEVar8 = ppEVar2[-1] + 4;
      }
      pEVar15 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      psVar9 = Interface::getName_abi_cxx11_(&pEVar8[-1].super_Interface);
      local_118._8_8_ = (psVar9->_M_dataplus)._M_p;
      local_118._0_8_ = psVar9->_M_string_length;
      pmVar10 = CLI::std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                              *)local_e8._M_left,(key_type *)local_118);
      *pmVar10 = (int)((ulong)((long)pEVar15 - (long)pEVar4) >> 3) * -0x11111111 +
                 (int)(uVar13 >> 3) * -0x11111111 +
                 ((int)((ulong)((long)ppEVar2 - (long)ppEVar3) >> 3) + -1 +
                 (uint)(ppEVar2 == (_Map_pointer)0x0)) * 4 + -1;
      pEVar15 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      ppEVar2 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar13 = (long)pEVar15 -
               (long)(this->endpoints).
                     super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first;
      if (uVar13 == 0) {
        pEVar15 = ppEVar2[-1] + 4;
      }
      local_118._0_4_ = pEVar15[-1].super_Interface.handle.hid;
      local_68.m_object =
           (pointer)CONCAT44(local_68.m_object._4_4_,
                             (int)(uVar13 >> 3) * -0x11111111 +
                             ((int)((ulong)((long)ppEVar2 -
                                           (long)(this->endpoints).
                                                 super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_node)
                                   >> 3) + -1 + (uint)(ppEVar2 == (_Map_pointer)0x0)) * 4 +
                             (int)((ulong)((long)(this->endpoints).
                                                 super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                                          (long)(this->endpoints).
                                                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                  3) * -0x11111111 + -1);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
      ::_M_emplace_unique<helics::InterfaceHandle,int>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                  *)&this->eptids,(InterfaceHandle *)local_118,(int *)(local_78 + 0x10));
      iVar17 = iVar17 + 1;
    } while (iVar6 != iVar17);
  }
  fileops::loadJson((fileops *)(local_c8 + 0x10),(string *)local_48);
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_c8 + 0x10),"tag");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78,pvVar11);
  if (local_78[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78);
    key_00._M_str = (char *)local_118._0_8_;
    key_00._M_len = local_118._8_8_;
    addSubscription(this,key_00);
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else if (local_78[0] == array) {
    local_118._8_8_ = (_Rb_tree_node_base *)0x0;
    local_118._24_8_ = -0x8000000000000000;
    local_118._16_8_ =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_78._8_8_)->_M_impl).super__Vector_impl_data._M_start;
    local_68.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_68.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_68.m_it.array_iterator._M_current =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_78._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_118._0_8_ = (_Rb_tree_node_base *)local_78;
    local_68.m_object = (pointer)local_78;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_118,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)(local_78 + 0x10));
      if (bVar5) break;
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      key._M_str = (char *)local_f8;
      key._M_len = local_f0;
      addSubscription(this,key);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (*(char *)local_118._0_8_ == '\x02') {
        local_118._16_8_ = local_118._16_8_ + 0x10;
      }
      else if (*(char *)local_118._0_8_ == '\x01') {
        local_118._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._8_8_);
      }
      else {
        local_118._24_8_ = local_118._24_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_c8 + 0x10),"sourceclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88,pvVar11);
  if (local_88[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88);
    sourceEndpoint_00._M_str = (char *)local_118._0_8_;
    sourceEndpoint_00._M_len = local_118._8_8_;
    addSourceEndpointClone(this,sourceEndpoint_00);
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else if (local_88[0] == array) {
    local_118._8_8_ = (_Rb_tree_node_base *)0x0;
    local_118._24_8_ = -0x8000000000000000;
    local_118._16_8_ =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_88._8_8_)->_M_impl).super__Vector_impl_data._M_start;
    local_68.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_68.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_68.m_it.array_iterator._M_current =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_88._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_118._0_8_ = (_Rb_tree_node_base *)local_88;
    local_68.m_object = (pointer)local_88;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_118,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)(local_78 + 0x10));
      if (bVar5) break;
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      sourceEndpoint._M_str = (char *)local_f8;
      sourceEndpoint._M_len = local_f0;
      addSourceEndpointClone(this,sourceEndpoint);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (*(char *)local_118._0_8_ == '\x02') {
        local_118._16_8_ = local_118._16_8_ + 0x10;
      }
      else if (*(char *)local_118._0_8_ == '\x01') {
        local_118._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._8_8_);
      }
      else {
        local_118._24_8_ = local_118._24_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_c8 + 0x10),"destclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98,pvVar11);
  if (local_98[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98);
    destEndpoint_00._M_str = (char *)local_118._0_8_;
    destEndpoint_00._M_len = local_118._8_8_;
    addDestEndpointClone(this,destEndpoint_00);
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else if (local_98[0] == array) {
    local_118._8_8_ = (_Rb_tree_node_base *)0x0;
    local_118._24_8_ = -0x8000000000000000;
    local_118._16_8_ =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_98._8_8_)->_M_impl).super__Vector_impl_data._M_start;
    local_68.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_68.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_68.m_it.array_iterator._M_current =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_98._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_118._0_8_ = (_Rb_tree_node_base *)local_98;
    local_68.m_object = (pointer)local_98;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_118,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)(local_78 + 0x10));
      if (bVar5) break;
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      destEndpoint._M_str = (char *)local_f8;
      destEndpoint._M_len = local_f0;
      addDestEndpointClone(this,destEndpoint);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (*(char *)local_118._0_8_ == '\x02') {
        local_118._16_8_ = local_118._16_8_ + 0x10;
      }
      else if (*(char *)local_118._0_8_ == '\x01') {
        local_118._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._8_8_);
      }
      else {
        local_118._24_8_ = local_118._24_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_c8 + 0x10),"clone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_c8,pvVar11);
  if (local_c8[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_c8);
    sourceEndpoint_02._M_str = (char *)local_118._0_8_;
    sourceEndpoint_02._M_len = local_118._8_8_;
    addSourceEndpointClone(this,sourceEndpoint_02);
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_c8);
    destEndpoint_02._M_str = (char *)local_118._0_8_;
    destEndpoint_02._M_len = local_118._8_8_;
    addDestEndpointClone(this,destEndpoint_02);
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else if (local_c8[0] == array) {
    local_118._8_8_ = (_Rb_tree_node_base *)0x0;
    local_118._24_8_ = -0x8000000000000000;
    local_118._16_8_ =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_c8._8_8_)->_M_impl).super__Vector_impl_data._M_start;
    local_68.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_68.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_68.m_it.array_iterator._M_current =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_c8._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_118._0_8_ = (_Rb_tree_node_base *)local_c8;
    local_68.m_object = (pointer)local_c8;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_118,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)(local_78 + 0x10));
      if (bVar5) break;
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      sourceEndpoint_01._M_str = (char *)local_f8;
      sourceEndpoint_01._M_len = local_f0;
      addSourceEndpointClone(this,sourceEndpoint_01);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      destEndpoint_01._M_str = (char *)local_f8;
      destEndpoint_01._M_len = local_f0;
      addDestEndpointClone(this,destEndpoint_01);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (*(char *)local_118._0_8_ == '\x02') {
        local_118._16_8_ = local_118._16_8_ + 0x10;
      }
      else if (*(char *)local_118._0_8_ == '\x01') {
        local_118._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._8_8_);
      }
      else {
        local_118._24_8_ = local_118._24_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_c8 + 0x10),"capture");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_a8,pvVar11);
  if (local_a8[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_a8);
    local_68.m_object = (pointer)local_118._8_8_;
    local_68.m_it.object_iterator._M_node = (_Base_ptr)local_118._0_8_;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->captureInterfaces,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 0x10));
    if ((_Rb_tree_node_base *)local_118._0_8_ != (_Rb_tree_node_base *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else if (local_a8[0] == array) {
    local_118._8_8_ = (_Rb_tree_node_base *)0x0;
    local_118._24_8_ = -0x8000000000000000;
    local_118._16_8_ =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_a8._8_8_)->_M_impl).super__Vector_impl_data._M_start;
    local_68.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_68.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_68.m_it.array_iterator._M_current =
         (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            *)local_a8._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_118._0_8_ = (_Rb_tree_node_base *)local_a8;
    local_68.m_object = (pointer)local_a8;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_118,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)(local_78 + 0x10));
      if (bVar5) break;
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pbVar12);
      local_40._M_len = local_f0;
      local_40._M_str = (char *)local_f8;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->captureInterfaces,&local_40);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (*(char *)local_118._0_8_ == '\x02') {
        local_118._16_8_ = local_118._16_8_ + 0x10;
      }
      else if (*(char *)local_118._0_8_ == '\x01') {
        local_118._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._8_8_);
      }
      else {
        local_118._24_8_ = local_118._24_8_ + 1;
      }
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_a8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_c8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)(local_c8 + 0x10));
  return;
}

Assistant:

void Recorder::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("recorder", jsonString, enableFederateInterfaceRegistration);

    auto subCount = fed->getInputCount();
    for (int ii = 0; ii < subCount; ++ii) {
        subscriptions.emplace_back(fed->getInput(ii));
        targets.emplace_back(subscriptions.back().getTarget());
        subids.emplace(subscriptions.back().getHandle(),
                       static_cast<int>(subscriptions.size()) - 1);
        subkeys.emplace(subscriptions.back().getTarget(),
                        static_cast<int>(subscriptions.size()) - 1);
    }
    auto eptCount = fed->getEndpointCount();
    for (int ii = 0; ii < eptCount; ++ii) {
        endpoints.emplace_back(fed->getEndpoint(ii));
        eptNames[endpoints.back().getName()] = static_cast<int>(endpoints.size() - 1);
        eptids.emplace(endpoints.back().getHandle(), static_cast<int>(endpoints.size() - 1));
    }

    auto doc = fileops::loadJson(jsonString);

    auto tags = doc["tag"];
    if (tags.is_array()) {
        for (const auto& tag : tags) {
            addSubscription(tag.get<std::string>());
        }
    } else if (tags.is_string()) {
        addSubscription(tags.get<std::string>());
    }
    auto sourceClone = doc["sourceclone"];
    if (sourceClone.is_array()) {
        for (const auto& clone : sourceClone) {
            addSourceEndpointClone(clone.get<std::string>());
        }
    } else if (sourceClone.is_string()) {
        addSourceEndpointClone(sourceClone.get<std::string>());
    }
    auto destClone = doc["destclone"];
    if (destClone.is_array()) {
        for (const auto& clone : destClone) {
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (destClone.is_string()) {
        addDestEndpointClone(destClone.get<std::string>());
    }
    auto clones = doc["clone"];
    if (clones.is_array()) {
        for (const auto& clone : clones) {
            addSourceEndpointClone(clone.get<std::string>());
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (clones.is_string()) {
        addSourceEndpointClone(clones.get<std::string>());
        addDestEndpointClone(clones.get<std::string>());
    }
    auto captures = doc["capture"];
    if (captures.is_array()) {
        for (const auto& capture : captures) {
            addCapture(capture.get<std::string>());
        }
    } else if (captures.is_string()) {
        addCapture(captures.get<std::string>());
    }
}